

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O0

void __thiscall
booster::callback<void(std::error_code_const&)>::callback<void(*)(std::error_code_const&)>
          (callback<void_(const_std::error_code_&)> *this,_func_void_error_code_ptr *func)

{
  callable<void_(const_std::error_code_&)> *p;
  callable_impl<void,_void_(*)(const_std::error_code_&)> *in_RDI;
  _func_void_error_code_ptr *in_stack_ffffffffffffffc8;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *in_stack_ffffffffffffffe0;
  
  p = (callable<void_(const_std::error_code_&)> *)operator_new(0x18);
  callback<void_(const_std::error_code_&)>::callable_impl<void,_void_(*)(const_std::error_code_&)>::
  callable_impl(in_RDI,in_stack_ffffffffffffffc8);
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            (in_stack_ffffffffffffffe0,p,SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}